

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsView::fitInView(QGraphicsView *this,QRectF *rect,AspectRatioMode aspectRatioMode)

{
  bool bVar1;
  QWidget *this_00;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  QRect QVar8;
  QPointF local_88;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)(*(long *)(this + 8) + 0x490));
  if ((bVar1) && ((((rect->w != 0.0 || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))))) {
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    local_78 = (undefined1  [16])0x0;
    local_68 = 1.0;
    dStack_60 = 1.0;
    QTransform::mapRect((QRectF *)&local_58);
    if ((0.0 < (double)CONCAT44(uStack_44,local_48)) &&
       (0.0 < (double)CONCAT44(uStack_3c,uStack_40))) {
      scale(this,1.0 / (double)CONCAT44(uStack_44,local_48),
            1.0 / (double)CONCAT44(uStack_3c,uStack_40));
      this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QVar8 = QWidget::rect(this_00);
      lVar3 = (long)(QVar8.x2.m_i.m_i + -2) - (long)(QVar8.x1.m_i.m_i + 2);
      if ((-1 < lVar3) &&
         (lVar2 = (QVar8._8_8_ + -0x200000000 >> 0x20) - (QVar8._0_8_ + 0x200000000 >> 0x20),
         -1 < lVar2)) {
        local_68 = -NAN;
        dStack_60 = -NAN;
        local_78._8_4_ = 0xffffffff;
        local_78._0_8_ = 0xffffffffffffffff;
        local_78._12_4_ = 0xffffffff;
        QTransform::mapRect((QRectF *)local_78);
        if ((0.0 < local_68) && (0.0 < dStack_60)) {
          dVar4 = (double)(lVar3 + 1) / local_68;
          dVar6 = (double)(lVar2 + 1) / dStack_60;
          dVar7 = dVar6;
          dVar5 = dVar4;
          if (aspectRatioMode == KeepAspectRatioByExpanding) {
            dVar5 = dVar6;
            if (dVar6 <= dVar4) {
              dVar7 = dVar4;
              dVar5 = dVar4;
            }
          }
          else if ((aspectRatioMode == KeepAspectRatio) && (dVar7 = dVar4, dVar6 <= dVar4)) {
            dVar7 = dVar6;
            dVar5 = dVar6;
          }
          scale(this,dVar5,dVar7);
          local_88 = QRectF::center(rect);
          centerOn(this,&local_88);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::fitInView(const QRectF &rect, Qt::AspectRatioMode aspectRatioMode)
{
    Q_D(QGraphicsView);
    if (!d->scene || rect.isNull())
        return;

    // Reset the view scale to 1:1.
    QRectF unity = d->matrix.mapRect(QRectF(0, 0, 1, 1));
    if (unity.isEmpty())
        return;
    scale(1 / unity.width(), 1 / unity.height());

    // Find the ideal x / y scaling ratio to fit \a rect in the view.
    int margin = 2;
    QRectF viewRect = viewport()->rect().adjusted(margin, margin, -margin, -margin);
    if (viewRect.isEmpty())
        return;
    QRectF sceneRect = d->matrix.mapRect(rect);
    if (sceneRect.isEmpty())
        return;
    qreal xratio = viewRect.width() / sceneRect.width();
    qreal yratio = viewRect.height() / sceneRect.height();

    // Respect the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Scale and center on the center of \a rect.
    scale(xratio, yratio);
    centerOn(rect.center());
}